

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O1

int __thiscall XInputSimulatorImplLinux::charToKeyCode(XInputSimulatorImplLinux *this,char key_char)

{
  byte bVar1;
  long *plVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cchar: ",7);
  iVar3 = (int)CONCAT71(in_register_00000031,key_char);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  bVar1 = XKeysymToKeycode(this->display,(long)iVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ccode: ",7);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)bVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return (uint)bVar1;
}

Assistant:

int XInputSimulatorImplLinux::charToKeyCode(char key_char)
{
    std::cout << "cchar: " << (int)key_char << std::endl;

    int keyCode = XKeysymToKeycode(display, key_char);
//    int keyCode = XKeysymToKeycode(display, XStringToKeysym(&key_char));
    std::cout << "ccode: " << keyCode << std::endl;

    return keyCode;
}